

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

size_t __thiscall
obx::Box<objectbox::tsdemo::SensorValues>::
putMany<std::vector<objectbox::tsdemo::SensorValues,std::allocator<objectbox::tsdemo::SensorValues>>>
          (Box<objectbox::tsdemo::SensorValues> *this,
          vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
          *objects,vector<unsigned_long,_std::allocator<unsigned_long>_> *outIds,OBXPutMode mode)

{
  pointer puVar1;
  pointer pSVar2;
  iterator __position;
  OBX_cursor *pOVar3;
  obx_err err;
  FlatBufferBuilder *pFVar4;
  uint8_t *puVar5;
  unsigned_long uVar6;
  size_t sVar7;
  pointer object;
  obx_id id;
  CursorTx cursor;
  unsigned_long local_60;
  CursorTx local_58;
  
  if (outIds != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    puVar1 = (outIds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((outIds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (outIds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (outIds,((long)(objects->
                             super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(objects->
                             super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7)
    ;
  }
  if ((objects->
      super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (objects->
      super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    sVar7 = 0;
  }
  else {
    anon_unknown_3::CursorTx::CursorTx(&local_58,WRITE,(this->super_BoxTypeless).store_,2);
    pFVar4 = internal::threadLocalFbbDirty();
    object = (objects->
             super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pSVar2 = (objects->
             super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (object == pSVar2) {
      sVar7 = 0;
    }
    else {
      sVar7 = 0;
      do {
        objectbox::tsdemo::SensorValues::_OBX_MetaInfo::toFlatBuffer(pFVar4,object);
        pOVar3 = local_58.cCursor_;
        puVar5 = flatbuffers::FlatBufferBuilderImpl<false>::GetBufferPointer(pFVar4);
        uVar6 = obx_cursor_put_object4(pOVar3,puVar5,(pFVar4->buf_).size_,mode);
        if (uVar6 == 0) {
          err = obx_last_error_code();
          internal::throwLastError(err,(char *)0x0);
        }
        object->id = uVar6;
        local_60 = uVar6;
        if (outIds != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
          __position._M_current =
               (outIds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (outIds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)outIds,__position,
                       &local_60);
          }
          else {
            *__position._M_current = uVar6;
            (outIds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        sVar7 = (sVar7 + 1) - (ulong)(local_60 == 0);
        object = object + 1;
      } while (object != pSVar2);
    }
    pFVar4 = internal::threadLocalFbbDirty();
    if (0x80000 < (pFVar4->buf_).size_) {
      flatbuffers::FlatBufferBuilderImpl<false>::Reset(pFVar4);
    }
    if (local_58.cCursor_ == (OBX_cursor *)0x0) {
      internal::throwIllegalStateException("State condition failed: ","cCursor_");
    }
    obx_cursor_close();
    local_58.cCursor_ = (OBX_cursor *)0x0;
    Transaction::success(&local_58.tx_);
    anon_unknown_3::CursorTx::~CursorTx(&local_58);
  }
  return sVar7;
}

Assistant:

size_t putMany(Vector& objects, std::vector<obx_id>* outIds, OBXPutMode mode) {
        if (outIds) {
            outIds->clear();
            outIds->reserve(objects.size());
        }

        // Don't start a TX in case there's no data.
        // Note: Don't move this above clearing outIds vector - our contract says that we clear outIds before starting
        // execution, so we must do it even if no objects were passed.
        if (objects.empty()) return 0;

        size_t count = 0;
        CursorTx cursor(TxMode::WRITE, store_, EntityBinding::entityId());
        flatbuffers::FlatBufferBuilder& fbb = internal::threadLocalFbbDirty();

        for (auto& object : objects) {
            obx_id id = cursorPut(cursor, fbb, object, mode);  // type-based overloads below
            if (outIds) outIds->push_back(id);  // always include in outIds even if the item wasn't present (id == 0)
            if (id) count++;
        }
        internal::threadLocalFbbDone();  // NOTE might not get called in case of an exception
        cursor.commitAndClose();
        return count;
    }